

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<4,_13,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  Vector<float,_4> *b;
  long lVar5;
  Vector<float,_4> *pVVar6;
  long lVar7;
  undefined4 uVar8;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  Vec4 *local_140;
  ulong local_138;
  float local_130 [6];
  float local_118 [4];
  float local_108 [6];
  float local_f0 [3];
  float local_e4 [3];
  Matrix<float,_4,_4> local_d8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Matrix<float,_4,_4> local_50;
  
  puVar1 = &local_98;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      lVar5 = lVar5 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    local_98 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_90 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_88 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_80 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_78 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_70 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_68 = *(undefined8 *)evalCtx->in[3].m_data;
    uStack_60 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    puVar4 = &s_constInMat4x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar5 * 4) = *(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar3 = lVar3 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 4;
    } while (lVar3 != 4);
  }
  pfVar2 = (float *)&local_d8;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    b = (Vector<float,_4> *)0x0;
    lVar3 = 0;
    do {
      pVVar6 = (Vector<float,_4> *)0x0;
      do {
        uVar8 = 0x3f800000;
        if (b != pVVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + (long)pVVar6) = uVar8;
        pVVar6 = pVVar6 + 1;
      } while (pVVar6 != (Vector<float,_4> *)0x40);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      b = (((Matrix<float,_4,_4> *)b)->m_data).m_data + 1;
    } while (lVar3 != 4);
    local_d8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_d8.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_d8.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_d8.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_d8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_d8.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_d8.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    local_d8.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    local_d8.m_data.m_data[3].m_data[0] = 0.0;
    local_d8.m_data.m_data[3].m_data[1] = 0.0;
    local_d8.m_data.m_data[3].m_data[2] = 0.0;
    local_d8.m_data.m_data[3].m_data[3] = 0.0;
    local_d8.m_data.m_data[2].m_data[0] = 0.0;
    local_d8.m_data.m_data[2].m_data[1] = 0.0;
    local_d8.m_data.m_data[2].m_data[2] = 0.0;
    local_d8.m_data.m_data[2].m_data[3] = 0.0;
    local_d8.m_data.m_data[1].m_data[0] = 0.0;
    local_d8.m_data.m_data[1].m_data[1] = 0.0;
    local_d8.m_data.m_data[1].m_data[2] = 0.0;
    local_d8.m_data.m_data[1].m_data[3] = 0.0;
    local_d8.m_data.m_data[0].m_data[0] = 0.0;
    local_d8.m_data.m_data[0].m_data[1] = 0.0;
    local_d8.m_data.m_data[0].m_data[2] = 0.0;
    local_d8.m_data.m_data[0].m_data[3] = 0.0;
    b = (Vector<float,_4> *)&DAT_01c379e0;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = *(float *)((long)b->m_data + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      b = b + 1;
    } while (lVar3 != 4);
  }
  matrixCompMult<float,4,4>
            (&local_50,(MatrixCaseUtils *)&local_98,&local_d8,(Matrix<float,_4,_4> *)b);
  local_e4[0] = local_50.m_data.m_data[0].m_data[0];
  local_e4[1] = local_50.m_data.m_data[0].m_data[1];
  local_e4[2] = local_50.m_data.m_data[0].m_data[2];
  local_f0[0] = local_50.m_data.m_data[1].m_data[1];
  local_f0[1] = local_50.m_data.m_data[1].m_data[2];
  local_f0[2] = local_50.m_data.m_data[1].m_data[3];
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  lVar3 = 0;
  do {
    local_118[lVar3] = local_108[lVar3 + 9] + local_108[lVar3 + 6];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_108[3] = local_50.m_data.m_data[2].m_data[2];
  local_108[4] = local_50.m_data.m_data[2].m_data[3];
  local_108[5] = local_50.m_data.m_data[2].m_data[0];
  local_140 = (Vec4 *)0x0;
  local_138 = local_138 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    *(float *)((long)&local_140 + lVar3 * 4) = local_118[lVar3] + local_108[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_108[0] = local_50.m_data.m_data[3].m_data[3];
  local_108[1] = local_50.m_data.m_data[3].m_data[0];
  local_108[2] = local_50.m_data.m_data[3].m_data[1];
  local_130[2] = 0.0;
  local_130[3] = 0.0;
  local_130[4] = 0.0;
  lVar3 = 0;
  do {
    local_130[lVar3 + 2] = *(float *)((long)&local_140 + lVar3 * 4) + local_108[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_140 = &evalCtx->color;
  local_138 = 0x100000000;
  local_130[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_140 + lVar3 * 4)] = local_130[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}